

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamEuler::EvaluateSectionFrame
          (ChElementBeamEuler *this,double eta,ChVector<double> *point,ChQuaternion<double> *rot)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer psVar5;
  element_type *peVar6;
  element_type *peVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  ChVector<double> u_rotaz;
  ChVector<double> u_displ;
  double local_68;
  double dStack_60;
  double local_58;
  ulong local_48;
  double dStack_40;
  ulong local_38;
  undefined1 extraout_var [56];
  
  local_48 = 0;
  dStack_40 = 0.0;
  local_38 = 0;
  local_58 = 0.0;
  local_68 = 0.0;
  dStack_60 = 0.0;
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[0x16]
  )(this,&local_48,&local_68);
  psVar5 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar6 = (psVar5->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar7 = psVar5[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar24 = (this->q_element_ref_rot).m_data[0];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar24;
  dVar1 = (this->q_element_ref_rot).m_data[1];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar1;
  dVar2 = (this->q_element_ref_rot).m_data[2];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar2;
  dVar3 = (this->q_element_ref_rot).m_data[3];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar3;
  dVar34 = (this->q_element_abs_rot).m_data[0];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar34;
  dVar8 = dVar34 * dVar34;
  dVar4 = (this->q_element_abs_rot).m_data[3];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar4;
  auVar28 = ZEXT816(0xbff0000000000000);
  auVar26 = ZEXT816(0x4000000000000000);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar8 + dVar4 * dVar4;
  auVar23 = vfmadd213sd_fma(auVar40,auVar26,auVar28);
  dVar24 = dVar24 * dVar24;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar24 + dVar3 * dVar3;
  auVar20 = vfmadd213sd_fma(auVar62,auVar26,auVar28);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = eta;
  auVar12 = vsubsd_avx512f(ZEXT816(0x3ff0000000000000),auVar72);
  dVar9 = auVar12._0_8_ * 0.5;
  auVar12 = vaddsd_avx512f(auVar72,ZEXT816(0x3ff0000000000000));
  dVar10 = auVar12._0_8_ * 0.5;
  dVar25 = dVar9 * (peVar6->X0).coord.pos.m_data[2] + dVar10 * (peVar7->X0).coord.pos.m_data[2];
  auVar14._8_8_ = 0x8000000000000000;
  auVar14._0_8_ = 0x8000000000000000;
  auVar13 = vxorpd_avx512vl(auVar43,auVar14);
  auVar14 = vmulsd_avx512f(auVar47,auVar13);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar1 * dVar3;
  auVar15 = vsubsd_avx512f(auVar70,auVar14);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)&(peVar6->X0).coord.pos;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar9;
  auVar12 = vmulsd_avx512f(auVar64,auVar12);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)&(peVar7->X0).coord.pos;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar10;
  auVar16 = vmulsd_avx512f(auVar66,auVar16);
  auVar16 = vaddsd_avx512f(auVar12,auVar16);
  dVar10 = dVar9 * (peVar6->X0).coord.pos.m_data[1] + dVar10 * (peVar7->X0).coord.pos.m_data[1];
  auVar12 = vmulsd_avx512f(auVar51,auVar13);
  auVar17 = vmulsd_avx512f(auVar47,auVar55);
  auVar18 = vaddsd_avx512f(auVar12,auVar17);
  auVar18 = vaddsd_avx512f(auVar18,auVar18);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dVar10;
  auVar18 = vmulsd_avx512f(auVar65,auVar18);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = auVar15._0_8_ + auVar15._0_8_;
  auVar15 = vfmadd231sd_avx512f(auVar18,auVar16,auVar44);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar25;
  auVar15 = vfmadd231sd_avx512f(auVar15,auVar68,auVar20);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_38;
  auVar15 = vaddsd_avx512f(auVar15,auVar20);
  dVar3 = (this->q_element_abs_rot).m_data[1];
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar3;
  auVar18 = vmulsd_avx512f(auVar37,auVar63);
  dVar9 = (this->q_element_abs_rot).m_data[2];
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar9;
  auVar19 = vmulsd_avx512f(auVar21,auVar73);
  auVar20 = vsubsd_avx512f(auVar18,auVar19);
  auVar20 = vaddsd_avx512f(auVar20,auVar20);
  auVar14 = vaddsd_avx512f(auVar14,auVar70);
  auVar21 = vmulsd_avx512f(auVar51,auVar51);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar24;
  auVar21 = vaddsd_avx512f(auVar59,auVar21);
  auVar21 = vfmadd213sd_avx512f(auVar21,auVar26,auVar28);
  auVar22 = vmulsd_avx512f(auVar55,auVar13);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar1 * dVar2;
  auVar13 = vsubsd_avx512f(auVar52,auVar22);
  auVar13 = vaddsd_avx512f(auVar13,auVar13);
  auVar13 = vmulsd_avx512f(auVar65,auVar13);
  auVar13 = vfmadd231sd_avx512f(auVar13,auVar16,auVar21);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = auVar14._0_8_ + auVar14._0_8_;
  auVar14 = vfmadd231sd_avx512f(auVar13,auVar68,auVar71);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_48;
  auVar13 = vaddsd_avx512f(auVar14,auVar13);
  auVar14 = vsubsd_avx512f(auVar17,auVar12);
  dVar1 = dVar1 * dVar2 + auVar22._0_8_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar24 + dVar2 * dVar2;
  auVar12 = vfmadd213sd_fma(auVar48,auVar26,auVar28);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar10 * auVar12._0_8_;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd231sd_avx512f(auVar49,auVar16,auVar53);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = auVar14._0_8_ + auVar14._0_8_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar25;
  auVar12 = vfmadd231sd_fma(auVar12,auVar69,auVar67);
  dVar24 = auVar12._0_8_ + dStack_40;
  auVar12 = vmulsd_avx512f(auVar37,auVar73);
  dVar1 = dVar3 * dVar34 + auVar12._0_8_;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = (dVar1 + dVar1) * dVar24;
  auVar16 = vfmadd231sd_avx512f(auVar60,auVar13,auVar20);
  auVar16 = vfmadd231sd_fma(auVar16,auVar15,auVar23);
  dVar2 = auVar12._0_8_ - dVar3 * dVar34;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = dVar9;
  auVar23 = vmulsd_avx512f(auVar63,auVar74);
  dVar1 = auVar23._0_8_ + dVar34 * dVar4;
  auVar12 = vmulsd_avx512f(auVar74,auVar74);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = auVar12._0_8_ + dVar8;
  auVar12 = vfmadd213sd_fma(auVar56,auVar26,auVar28);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar1 + dVar1;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = auVar12._0_8_ * dVar24;
  auVar12 = vfmadd231sd_fma(auVar57,auVar13,auVar22);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar2 + dVar2;
  auVar20 = vfmadd231sd_fma(auVar12,auVar15,auVar41);
  auVar14 = vaddsd_avx512f(auVar18,auVar19);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar8 + dVar3 * dVar3;
  auVar12 = vfmadd213sd_fma(auVar17,auVar26,auVar28);
  dVar1 = auVar23._0_8_ - dVar34 * dVar4;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar24 * (dVar1 + dVar1);
  auVar12 = vfmadd231sd_fma(auVar18,auVar13,auVar12);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = auVar14._0_8_ + auVar14._0_8_;
  auVar12 = vfmadd231sd_fma(auVar12,auVar15,auVar28);
  point->m_data[0] = auVar12._0_8_;
  point->m_data[1] = auVar20._0_8_;
  point->m_data[2] = auVar16._0_8_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_68;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dStack_60 * dStack_60;
  auVar12 = vfmadd231sd_fma(auVar19,auVar23,auVar23);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_58;
  auVar12 = vfmadd213sd_fma(auVar15,auVar15,auVar12);
  if (auVar12._0_8_ < 0.0) {
    dVar24 = sqrt(auVar12._0_8_);
  }
  else {
    auVar12 = vsqrtsd_avx(auVar12,auVar12);
    dVar24 = auVar12._0_8_;
  }
  dVar3 = local_58;
  dVar2 = dStack_60;
  dVar1 = local_68;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = local_68;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_58;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dStack_60 * dStack_60;
  auVar12 = vfmadd231sd_fma(auVar26,auVar31,auVar31);
  auVar12 = vfmadd231sd_fma(auVar12,auVar29,auVar29);
  if (auVar12._0_8_ < 0.0) {
    dVar34 = sqrt(auVar12._0_8_);
  }
  else {
    auVar12 = vsqrtsd_avx(auVar12,auVar12);
    dVar34 = auVar12._0_8_;
  }
  dVar25 = sin(dVar24 * 0.5);
  auVar27._0_8_ = cos(dVar24 * 0.5);
  auVar27._8_56_ = extraout_var;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = (this->q_element_abs_rot).m_data[0];
  dVar24 = (this->q_element_abs_rot).m_data[1];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar24;
  bVar11 = 2.2250738585072014e-308 <= dVar34;
  dVar34 = 1.0 / dVar34;
  dVar4 = dVar25 * (double)((ulong)bVar11 * (long)(dVar34 * dVar2));
  dVar2 = (this->q_element_abs_rot).m_data[2];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar2;
  dVar9 = dVar25 * (double)((ulong)bVar11 * (long)(dVar34 * dVar1) +
                           (ulong)!bVar11 * 0x3ff0000000000000);
  dVar25 = dVar25 * (double)((ulong)bVar11 * (long)(dVar34 * dVar3));
  dVar1 = (this->q_element_abs_rot).m_data[3];
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar1;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar25;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = auVar27._0_8_ * dVar1;
  auVar12 = vfmadd231sd_fma(auVar54,auVar30,auVar35);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar9;
  auVar12 = vfnmadd231sd_fma(auVar12,auVar42,auVar45);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar4;
  auVar12 = vfmadd231sd_fma(auVar12,auVar32,auVar38);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = auVar27._0_8_ * dVar2;
  auVar16 = vfmadd231sd_fma(auVar58,auVar30,auVar38);
  auVar16 = vfmadd231sd_fma(auVar16,auVar50,auVar45);
  auVar13 = vfnmadd231sd_fma(auVar16,auVar32,auVar35);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar9;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = auVar27._0_8_ * dVar24;
  auVar16 = vfmadd231sd_fma(auVar61,auVar30,auVar46);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar4;
  auVar16 = vfnmadd231sd_fma(auVar16,auVar50,auVar39);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar25;
  auVar16 = vfmadd231sd_fma(auVar16,auVar42,auVar36);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar9 * dVar24;
  auVar20 = vfmsub231sd_fma(auVar33,auVar30,auVar27._0_16_);
  auVar20 = vfnmadd231sd_fma(auVar20,auVar42,auVar39);
  auVar20 = vfnmadd231sd_fma(auVar20,auVar50,auVar36);
  rot->m_data[0] = auVar20._0_8_;
  rot->m_data[1] = auVar16._0_8_;
  rot->m_data[2] = auVar13._0_8_;
  rot->m_data[3] = auVar12._0_8_;
  return;
}

Assistant:

void ChElementBeamEuler::EvaluateSectionFrame(const double eta, ChVector<>& point, ChQuaternion<>& rot) {
    ChVector<> u_displ;
    ChVector<> u_rotaz;
    double Nx1 = (1. / 2.) * (1 - eta);
    double Nx2 = (1. / 2.) * (1 + eta);

    this->EvaluateSectionDisplacement(eta, u_displ, u_rotaz);

    // Since   d = [Atw]' Xt - [A0w]'X0   , so we have
    //        Xt = [Atw] (d +  [A0w]'X0)

    point = this->q_element_abs_rot.Rotate(u_displ +
                                           this->q_element_ref_rot.RotateBack(Nx1 * this->nodes[0]->GetX0().GetPos() +
                                                                              Nx2 * this->nodes[1]->GetX0().GetPos()));

    ChQuaternion<> msectionrot;
    msectionrot.Q_from_AngAxis(u_rotaz.Length(), u_rotaz.GetNormalized());
    rot = this->q_element_abs_rot % msectionrot;
}